

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O3

void __thiscall RK_Individual::resetaPesos(RK_Individual *this,float valor)

{
  int iVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  auVar3 = _DAT_0010b4f0;
  iVar1 = this->number_of_edges;
  if (0 < (long)iVar1) {
    pdVar2 = this->weights;
    lVar4 = (long)iVar1 + -1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    auVar5 = auVar5 ^ _DAT_0010b4f0;
    auVar6 = _DAT_0010b4e0;
    do {
      auVar8 = auVar6 ^ auVar3;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(double *)((long)pdVar2 + lVar4) = (double)valor;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(double *)((long)pdVar2 + lVar4 + 8) = (double)valor;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(iVar1 + 1U >> 1) << 4 != lVar4);
  }
  return;
}

Assistant:

void RK_Individual::resetaPesos(float valor){
    for(int i=0; i< this->getNumEdges(); i++)
        this->weights[i] = valor;
}